

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
VectorInstance::op_insert_beforeIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer psVar1;
  undefined8 *puVar2;
  shared_ptr<Instance> instance;
  undefined1 auStack_88 [104];
  int local_20;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  get_shared_instance((string *)auStack_88,&this->_element_type);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)(auStack_88 + 0x10),
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  CharacterInstance::~CharacterInstance((CharacterInstance *)(auStack_88 + 0x10));
  if ((-1 < (long)local_20) &&
     (psVar1 = (this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_20 <=
     (int)((ulong)((long)(this->_value).
                         super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4))) {
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::insert
              (&this->_value,psVar1 + local_20,(value_type *)auStack_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_);
    }
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_insert_beforeIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int index = IntegerInstance(arguments[1]).value();
    if (index < 0 || index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.insert(_value.begin() + index, instance);
    return "null";
}